

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O1

bool __thiscall
sptk::GaussianMixtureModeling::Initialize
          (GaussianMixtureModeling *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          )

{
  SymmetricMatrix *pSVar1;
  int *piVar2;
  double dVar3;
  int iVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pdVar8;
  bool bVar9;
  double *pdVar10;
  uint uVar11;
  vector<double,_std::allocator<double>_> *vector;
  vector<double,_std::allocator<double>_> *data;
  GaussianMixtureModeling *this_00;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  long lVar15;
  ulong uVar16;
  vector<double,_std::allocator<double>_> mean;
  vector<int,_std::allocator<int>_> codebook_indices;
  vector<int,_std::allocator<int>_> num_data_in_cluster;
  long local_160;
  Row local_158;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_140;
  ulong local_138;
  ulong local_130;
  GaussianMixtureModeling *local_128;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_120;
  double local_118;
  long local_110;
  long local_108;
  StatisticsAccumulation local_100;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e8;
  long local_e0;
  double local_d8;
  LindeBuzoGrayAlgorithm local_d0;
  
  local_140 = mean_vectors;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(mean_vectors);
  local_128 = this;
  StatisticsAccumulation::StatisticsAccumulation(&local_100,this->num_order_,1,false,false);
  StatisticsAccumulation::Buffer::Buffer((Buffer *)&local_d0);
  data = (input_vectors->
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (input_vectors->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (data != pvVar5) {
    do {
      bVar9 = StatisticsAccumulation::Run(&local_100,data,(Buffer *)&local_d0);
      if (!bVar9) {
        StatisticsAccumulation::Buffer::~Buffer((Buffer *)&local_d0);
        return false;
      }
      data = data + 1;
    } while (data != pvVar5);
  }
  local_158._vptr_Row = (_func_int **)0x0;
  local_158.matrix_ = (SymmetricMatrix *)0x0;
  local_158.row_ = 0;
  local_158._20_4_ = 0;
  bVar9 = StatisticsAccumulation::GetMean
                    (&local_100,(Buffer *)&local_d0,
                     (vector<double,_std::allocator<double>_> *)&local_158);
  if (bVar9) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(local_140,(value_type *)&local_158);
  }
  if (local_158._vptr_Row != (_func_int **)0x0) {
    operator_delete(local_158._vptr_Row);
  }
  StatisticsAccumulation::Buffer::~Buffer((Buffer *)&local_d0);
  if (!bVar9) {
    return false;
  }
  local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_100,
             ((long)(input_vectors->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(input_vectors->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (value_type_conflict2 *)&local_d0,(allocator_type *)&local_158);
  this_00 = local_128;
  if (1 < local_128->num_mixture_) {
    LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
              (&local_d0,local_128->num_order_,1,local_128->num_mixture_,1,1000,1e-05,1e-05,1);
    bVar9 = LindeBuzoGrayAlgorithm::Run
                      (&local_d0,input_vectors,local_140,
                       (vector<int,_std::allocator<int>_> *)&local_100,(double *)&local_158);
    if (!bVar9) {
      bVar9 = false;
      goto LAB_00109dfb;
    }
  }
  pvVar6 = (input_vectors->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar7 = (input_vectors->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_d0,(long)this_00->num_mixture_,
             (allocator_type *)&local_158);
  uVar16 = ((long)pvVar6 - (long)pvVar7 >> 3) * -0x5555555555555555;
  uVar14 = (uint)uVar16;
  if (0 < (int)uVar14) {
    uVar12 = 0;
    do {
      piVar2 = (int *)(CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                                local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_) +
                      (long)*(int *)((long)local_100._vptr_StatisticsAccumulation + uVar12 * 4) * 4)
      ;
      *piVar2 = *piVar2 + 1;
      uVar12 = uVar12 + 1;
    } while ((uVar14 & 0x7fffffff) != uVar12);
  }
  std::vector<double,_std::allocator<double>_>::resize(weights,(long)this_00->num_mixture_);
  iVar4 = this_00->num_mixture_;
  if (0 < (long)iVar4) {
    pdVar8 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      pdVar8[lVar13] =
           (double)*(int *)(CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                                     local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_) + lVar13 * 4) /
           (double)(int)uVar14;
      lVar13 = lVar13 + 1;
    } while (iVar4 != lVar13);
  }
  FloorWeight(this_00,weights);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::resize
            (covariance_matrices,(long)this_00->num_mixture_);
  local_e8 = input_vectors;
  if (0 < this_00->num_mixture_) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      SymmetricMatrix::Resize
                ((SymmetricMatrix *)
                 ((long)&((covariance_matrices->
                          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                 lVar13),this_00->num_order_ + 1);
      SymmetricMatrix::Fill
                ((SymmetricMatrix *)
                 ((long)&((covariance_matrices->
                          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                 lVar13),0.0);
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x40;
    } while (lVar15 < this_00->num_mixture_);
  }
  local_138 = uVar16;
  local_120 = covariance_matrices;
  if (0 < (int)uVar14) {
    pSVar1 = &this_00->mask_;
    local_138 = (ulong)(uVar14 & 0x7fffffff);
    local_130 = 0;
    do {
      if (-1 < this_00->num_order_) {
        local_108 = *(long *)&(local_e8->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[local_130].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
        local_e0 = (long)*(int *)((long)local_100._vptr_StatisticsAccumulation + local_130 * 4);
        local_110 = *(long *)&(local_140->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[local_e0].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
        local_e0 = local_e0 << 6;
        uVar16 = 0;
        do {
          local_d8 = *(double *)(local_108 + uVar16 * 8) - *(double *)(local_110 + uVar16 * 8);
          uVar14 = (uint)uVar16;
          uVar12 = 0;
          if (this_00->is_diagonal_ != false) {
            uVar12 = uVar16 & 0xffffffff;
          }
          uVar11 = (uint)uVar12;
          if ((uint)uVar12 <= uVar14) {
            uVar11 = uVar14;
          }
          do {
            local_158._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
            local_158.matrix_ = pSVar1;
            local_158.row_ = uVar14;
            pdVar10 = SymmetricMatrix::Row::operator[](&local_158,(int)uVar12);
            if ((*pdVar10 != 0.0) || (NAN(*pdVar10))) {
              dVar3 = *(double *)(local_108 + uVar12 * 8);
              local_118 = *(double *)(local_110 + uVar12 * 8);
              local_158.matrix_ =
                   (SymmetricMatrix *)
                   ((long)&((local_120->
                            super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                   local_e0);
              local_158._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
              local_158.row_ = uVar14;
              pdVar10 = SymmetricMatrix::Row::operator[](&local_158,(int)uVar12);
              *pdVar10 = (dVar3 - local_118) * local_d8 + *pdVar10;
            }
            uVar12 = uVar12 + 1;
          } while (uVar11 + 1 != uVar12);
          bVar9 = (long)uVar16 < (long)local_128->num_order_;
          this_00 = local_128;
          uVar16 = uVar16 + 1;
        } while (bVar9);
      }
      local_130 = local_130 + 1;
    } while (local_130 != local_138);
  }
  if (0 < this_00->num_mixture_) {
    pSVar1 = &this_00->mask_;
    local_160 = 0;
    do {
      if (-1 < this_00->num_order_) {
        local_118 = (double)(local_160 << 6);
        uVar14 = 0;
        do {
          uVar11 = 0;
          if (this_00->is_diagonal_ != false) {
            uVar11 = uVar14;
          }
          do {
            local_158._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
            local_158.matrix_ = pSVar1;
            local_158.row_ = uVar14;
            pdVar10 = SymmetricMatrix::Row::operator[](&local_158,uVar11);
            if ((*pdVar10 != 0.0) || (NAN(*pdVar10))) {
              iVar4 = *(int *)(CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                                        local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_) + local_160 * 4
                              );
              local_158.matrix_ =
                   (SymmetricMatrix *)
                   ((long)&((local_120->
                            super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                   (long)local_118);
              local_158._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
              local_158.row_ = uVar14;
              pdVar10 = SymmetricMatrix::Row::operator[](&local_158,uVar11);
              *pdVar10 = *pdVar10 / (double)iVar4;
            }
            uVar11 = uVar11 + 1;
          } while (uVar14 + 1 != uVar11);
          bVar9 = (int)uVar14 < local_128->num_order_;
          this_00 = local_128;
          uVar14 = uVar14 + 1;
        } while (bVar9);
      }
      local_160 = local_160 + 1;
    } while (local_160 < this_00->num_mixture_);
  }
  FloorVariance(this_00,local_120);
  if ((void *)CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                       local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                                     local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_));
  }
  bVar9 = true;
LAB_00109dfb:
  if (local_100._vptr_StatisticsAccumulation != (_func_int **)0x0) {
    operator_delete(local_100._vptr_StatisticsAccumulation);
  }
  return bVar9;
}

Assistant:

bool GaussianMixtureModeling::Initialize(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<double>* weights,
    std::vector<std::vector<double> >* mean_vectors,
    std::vector<SymmetricMatrix>* covariance_matrices) const {
  // Initialize codebook.
  {
    mean_vectors->clear();
    StatisticsAccumulation statistics_accumulation(num_order_, 1);
    StatisticsAccumulation::Buffer buffer;

    for (const std::vector<double>& vector : input_vectors) {
      if (!statistics_accumulation.Run(vector, &buffer)) {
        return false;
      }
    }

    std::vector<double> mean;
    if (!statistics_accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    mean_vectors->push_back(mean);
  }

  // Initialize mean vectors.
  std::vector<int> codebook_indices(input_vectors.size(), 0);
  if (2 <= num_mixture_) {
    const int num_iteration(1000);
    const double convergence_threshold(1e-5);
    const double splitting_factor(1e-5);
    const int seed(1);
    double distance;
    LindeBuzoGrayAlgorithm lbg(num_order_, 1, num_mixture_, 1, num_iteration,
                               convergence_threshold, splitting_factor, seed);
    if (!lbg.Run(input_vectors, mean_vectors, &codebook_indices, &distance)) {
      return false;
    }
  }

  // Count number of data for each cluster.
  const int num_data(static_cast<int>(input_vectors.size()));
  std::vector<int> num_data_in_cluster(num_mixture_);
  {
    const int* src(&(codebook_indices[0]));
    int* dst(&(num_data_in_cluster[0]));
    for (int t(0); t < num_data; ++t) {
      ++dst[src[t]];
    }
  }

  // Initialize weights.
  {
    weights->resize(num_mixture_);
    for (int k(0); k < num_mixture_; ++k) {
      (*weights)[k] = static_cast<double>(num_data_in_cluster[k]) / num_data;
    }
    FloorWeight(weights);
  }

  // Initialize covariances.
  {
    covariance_matrices->resize(num_mixture_);
    for (int k(0); k < num_mixture_; ++k) {
      (*covariance_matrices)[k].Resize(num_order_ + 1);
      (*covariance_matrices)[k].Fill(0.0);
    }

    for (int t(0); t < num_data; ++t) {
      const double* x(&(input_vectors[t][0]));
      const int k(codebook_indices[t]);
      const double* mu(&((*mean_vectors)[k][0]));
      for (int l(0); l <= num_order_; ++l) {
        const double diff1(x[l] - mu[l]);
        for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
          if (0.0 != mask_[l][m]) {
            const double diff2(x[m] - mu[m]);
            (*covariance_matrices)[k][l][m] += diff1 * diff2;
          }
        }
      }
    }

    for (int k(0); k < num_mixture_; ++k) {
      for (int l(0); l <= num_order_; ++l) {
        for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
          if (0.0 != mask_[l][m]) {
            (*covariance_matrices)[k][l][m] /= num_data_in_cluster[k];
          }
        }
      }
    }
    FloorVariance(covariance_matrices);
  }

  return true;
}